

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

void tplt_xfer(char *name,FILE *in,FILE *out,int *lineno)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  ushort **ppuVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  char line [1000];
  undefined8 local_420;
  char local_418 [1000];
  
  local_420 = lineno;
  pcVar3 = fgets(local_418,1000,(FILE *)in);
joined_r0x0010a3b4:
  if ((pcVar3 == (char *)0x0) || ((local_418[0] == '%' && (local_418[1] == '%')))) {
    return;
  }
  *local_420 = *local_420 + 1;
  if (name != (char *)0x0) {
    iVar7 = 0;
    iVar6 = 0;
    do {
      iVar2 = iVar7;
      if (local_418[iVar7] == 'P') {
        iVar1 = strncmp(local_418 + iVar7,"Parse",5);
        if ((iVar1 == 0) &&
           ((iVar7 == 0 ||
            (ppuVar4 = __ctype_b_loc(),
            (*(byte *)((long)*ppuVar4 + (ulong)(byte)local_418[(long)iVar7 + -1] * 2 + 1) & 4) == 0)
            ))) {
          if (iVar7 - iVar6 != 0 && iVar6 <= iVar7) {
            fprintf((FILE *)out,"%.*s",(ulong)(uint)(iVar7 - iVar6),local_418 + iVar6);
          }
          fputs(name,(FILE *)out);
          iVar2 = iVar7 + 4;
          iVar6 = iVar7 + 5;
        }
      }
      else if (local_418[iVar7] == '\0') goto LAB_0010a477;
      iVar7 = iVar2 + 1;
    } while( true );
  }
  lVar5 = 0;
  goto LAB_0010a47e;
LAB_0010a477:
  lVar5 = (long)iVar6;
LAB_0010a47e:
  fputs(local_418 + lVar5,(FILE *)out);
  pcVar3 = fgets(local_418,1000,(FILE *)in);
  goto joined_r0x0010a3b4;
}

Assistant:

PRIVATE void tplt_xfer(char *name, FILE *in, FILE *out, int *lineno)
{
  int i, iStart;
  char line[LINESIZE];
  while( fgets(line,LINESIZE,in) && (line[0]!='%' || line[1]!='%') ){
    (*lineno)++;
    iStart = 0;
    if( name ){
      for(i=0; line[i]; i++){
        if( line[i]=='P' && strncmp(&line[i],"Parse",5)==0
          && (i==0 || !ISALPHA(line[i-1]))
        ){
          if( i>iStart ) fprintf(out,"%.*s",i-iStart,&line[iStart]);
          fprintf(out,"%s",name);
          i += 4;
          iStart = i+1;
        }
      }
    }
    fprintf(out,"%s",&line[iStart]);
  }
}